

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::releaseCluster(btSoftBody *this,int index)

{
  Cluster *this_00;
  Cluster *c;
  Cluster *local_18;
  
  this_00 = (this->m_clusters).m_data[index];
  local_18 = this_00;
  if (this_00->m_leaf != (btDbvtNode *)0x0) {
    btDbvt::remove(&this->m_cdbvt,(char *)this_00->m_leaf);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&this_00->m_framerefs);
  btAlignedObjectArray<btSoftBody::Node_*>::~btAlignedObjectArray(&this_00->m_nodes);
  btAlignedObjectArray<float>::~btAlignedObjectArray(&this_00->m_masses);
  btAlignedFreeInternal(this_00);
  btAlignedObjectArray<btSoftBody::Cluster_*>::remove(&this->m_clusters,(char *)&local_18);
  return;
}

Assistant:

void			btSoftBody::releaseCluster(int index)
{
	Cluster*	c=m_clusters[index];
	if(c->m_leaf) m_cdbvt.remove(c->m_leaf);
	c->~Cluster();
	btAlignedFree(c);
	m_clusters.remove(c);
}